

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void deleteTable(sqlite3 *db,Table *pTable)

{
  Index *pIVar1;
  FKey *pFVar2;
  VTable *pVVar3;
  sqlite3 *psVar4;
  VTable *pVVar5;
  FKey *p_00;
  FKey *pFVar6;
  void *p;
  Index *p_01;
  long lVar7;
  
  p_01 = pTable->pIndex;
  while (p_01 != (Index *)0x0) {
    pIVar1 = p_01->pNext;
    if (((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) && (pTable->nModuleArg == 0)) {
      sqlite3HashInsert(&p_01->pSchema->idxHash,p_01->zName,(void *)0x0);
    }
    freeIndex(db,p_01);
    p_01 = pIVar1;
  }
  p_00 = pTable->pFKey;
  while (p_00 != (FKey *)0x0) {
    if ((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) {
      pFVar2 = p_00->pNextTo;
      if (p_00->pPrevTo == (FKey *)0x0) {
        pFVar6 = pFVar2;
        if (pFVar2 == (FKey *)0x0) {
          pFVar6 = p_00;
        }
        sqlite3HashInsert(&pTable->pSchema->fkeyHash,pFVar6->zTo,pFVar2);
      }
      else {
        p_00->pPrevTo->pNextTo = pFVar2;
      }
      if (p_00->pNextTo != (FKey *)0x0) {
        p_00->pNextTo->pPrevTo = p_00->pPrevTo;
      }
    }
    fkTriggerDelete(db,p_00->apTrigger[0]);
    fkTriggerDelete(db,p_00->apTrigger[1]);
    pFVar2 = p_00->pNextFrom;
    sqlite3DbFreeNN(db,p_00);
    p_00 = pFVar2;
  }
  sqlite3DeleteColumnNames(db,pTable);
  if (pTable->zName != (char *)0x0) {
    sqlite3DbFreeNN(db,pTable->zName);
  }
  if (pTable->zColAff != (char *)0x0) {
    sqlite3DbFreeNN(db,pTable->zColAff);
  }
  if (pTable->pSelect != (Select *)0x0) {
    clearSelect(db,pTable->pSelect,1);
  }
  if (pTable->pCheck != (ExprList *)0x0) {
    exprListDeleteNN(db,pTable->pCheck);
  }
  if ((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) {
    pVVar3 = pTable->pVTable;
    pTable->pVTable = (VTable *)0x0;
    while (pVVar3 != (VTable *)0x0) {
      psVar4 = pVVar3->db;
      pVVar5 = pVVar3->pNext;
      if (psVar4 == (sqlite3 *)0x0) {
        pTable->pVTable = pVVar3;
        pVVar3->pNext = (VTable *)0x0;
        pVVar3 = pVVar5;
      }
      else {
        pVVar3->pNext = psVar4->pDisconnect;
        psVar4->pDisconnect = pVVar3;
        pVVar3 = pVVar5;
      }
    }
  }
  if (pTable->azModuleArg != (char **)0x0) {
    if (0 < pTable->nModuleArg) {
      lVar7 = 0;
      do {
        if ((lVar7 != 1) && (pTable->azModuleArg[lVar7] != (char *)0x0)) {
          sqlite3DbFreeNN(db,pTable->azModuleArg[lVar7]);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pTable->nModuleArg);
    }
    if (pTable->azModuleArg != (char **)0x0) {
      sqlite3DbFreeNN(db,pTable->azModuleArg);
    }
  }
  sqlite3DbFreeNN(db,pTable);
  return;
}

Assistant:

static void SQLITE_NOINLINE deleteTable(sqlite3 *db, Table *pTable){
  Index *pIndex, *pNext;
  TESTONLY( int nLookaside; ) /* Used to verify lookaside not used for schema */

  /* Record the number of outstanding lookaside allocations in schema Tables
  ** prior to doing any free() operations.  Since schema Tables do not use
  ** lookaside, this number should not change. */
  TESTONLY( nLookaside = (db && (pTable->tabFlags & TF_Ephemeral)==0) ?
                         db->lookaside.nOut : 0 );

  /* Delete all indices associated with this table. */
  for(pIndex = pTable->pIndex; pIndex; pIndex=pNext){
    pNext = pIndex->pNext;
    assert( pIndex->pSchema==pTable->pSchema
         || (IsVirtual(pTable) && pIndex->idxType!=SQLITE_IDXTYPE_APPDEF) );
    if( (db==0 || db->pnBytesFreed==0) && !IsVirtual(pTable) ){
      char *zName = pIndex->zName; 
      TESTONLY ( Index *pOld = ) sqlite3HashInsert(
         &pIndex->pSchema->idxHash, zName, 0
      );
      assert( db==0 || sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      assert( pOld==pIndex || pOld==0 );
    }
    freeIndex(db, pIndex);
  }

  /* Delete any foreign keys attached to this table. */
  sqlite3FkDelete(db, pTable);

  /* Delete the Table structure itself.
  */
  sqlite3DeleteColumnNames(db, pTable);
  sqlite3DbFree(db, pTable->zName);
  sqlite3DbFree(db, pTable->zColAff);
  sqlite3SelectDelete(db, pTable->pSelect);
  sqlite3ExprListDelete(db, pTable->pCheck);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3VtabClear(db, pTable);
#endif
  sqlite3DbFree(db, pTable);

  /* Verify that no lookaside memory was used by schema tables */
  assert( nLookaside==0 || nLookaside==db->lookaside.nOut );
}